

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# about_impl.cpp
# Opt level: O0

Panel ui::panel::About(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  Panel PVar1;
  shared_ptr<ui::AboutImpl> local_20;
  
  ftxui::Make<ui::AboutImpl>();
  std::shared_ptr<ui::PanelBase>::shared_ptr<ui::AboutImpl,void>
            ((shared_ptr<ui::PanelBase> *)in_RDI,&local_20);
  std::shared_ptr<ui::AboutImpl>::~shared_ptr(&local_20);
  PVar1.super___shared_ptr<ui::PanelBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar1.super___shared_ptr<ui::PanelBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Panel)PVar1.super___shared_ptr<ui::PanelBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Panel About() {
  return Make<AboutImpl>();
}